

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O1

int run_test_pipe_bind_error_inval(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  undefined8 unaff_RBX;
  uv_pipe_t server;
  undefined1 auStack_228 [264];
  code *pcStack_120;
  undefined1 local_110 [264];
  
  pcStack_120 = (code *)0x164ea3;
  uVar2 = uv_default_loop();
  pcStack_120 = (code *)0x164eb2;
  iVar1 = uv_pipe_init(uVar2,local_110,0);
  if (iVar1 == 0) {
    pcStack_120 = (code *)0x164ecb;
    iVar1 = uv_pipe_bind(local_110,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_00164f56;
    pcStack_120 = (code *)0x164ee4;
    iVar1 = uv_pipe_bind(local_110,"/tmp/uv-test-sock2");
    if (iVar1 != -0x16) goto LAB_00164f5b;
    pcStack_120 = (code *)0x164efa;
    uv_close(local_110,close_cb);
    pcStack_120 = (code *)0x164eff;
    uVar2 = uv_default_loop();
    pcStack_120 = (code *)0x164f09;
    uv_run(uVar2,0);
    if (close_cb_called != 1) goto LAB_00164f60;
    pcStack_120 = (code *)0x164f17;
    unaff_RBX = uv_default_loop();
    pcStack_120 = (code *)0x164f2b;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_120 = (code *)0x164f35;
    uv_run(unaff_RBX,0);
    pcStack_120 = (code *)0x164f3a;
    uVar2 = uv_default_loop();
    pcStack_120 = (code *)0x164f42;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_120 = (code *)0x164f56;
    run_test_pipe_bind_error_inval_cold_1();
LAB_00164f56:
    pcStack_120 = (code *)0x164f5b;
    run_test_pipe_bind_error_inval_cold_2();
LAB_00164f5b:
    pcStack_120 = (code *)0x164f60;
    run_test_pipe_bind_error_inval_cold_3();
LAB_00164f60:
    pcStack_120 = (code *)0x164f65;
    run_test_pipe_bind_error_inval_cold_4();
  }
  pcStack_120 = run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  pcStack_120 = (code *)unaff_RBX;
  puVar3 = (undefined1 *)uv_default_loop();
  iVar1 = uv_pipe_init(puVar3,auStack_228,0);
  if (iVar1 == 0) {
    puVar3 = auStack_228;
    iVar1 = uv_listen(puVar3,0x1000,0);
    if (iVar1 != -0x16) goto LAB_0016500d;
    uv_close(auStack_228,close_cb);
    puVar3 = (undefined1 *)uv_default_loop();
    uv_run(puVar3,0);
    if (close_cb_called == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      puVar3 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00165017;
    }
  }
  else {
    run_test_pipe_listen_without_bind_cold_1();
LAB_0016500d:
    run_test_pipe_listen_without_bind_cold_2();
  }
  run_test_pipe_listen_without_bind_cold_3();
LAB_00165017:
  run_test_pipe_listen_without_bind_cold_4();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_bind_error_inval) {
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT(r == 0);
  r = uv_pipe_bind(&server, TEST_PIPENAME);
  ASSERT(r == 0);
  r = uv_pipe_bind(&server, TEST_PIPENAME_2);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}